

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O3

void Pla_ManHashCubes(Pla_Man_t *p,Tab_Man_t *pTab)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Tab_Obj_t *pTVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  (p->vHashes).nSize = 0;
  iVar1 = (p->vCubes).nSize;
  if ((p->vHashes).nCap < iVar1) {
    piVar4 = (p->vHashes).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)iVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)iVar1 << 2);
    }
    (p->vHashes).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vHashes).nCap = iVar1;
  }
  if (0 < (p->vCubeLits).nSize) {
    lVar9 = 0;
    do {
      pVVar2 = (p->vCubeLits).pArray;
      lVar5 = (long)pVVar2[lVar9].nSize;
      uVar7 = 0;
      if (0 < lVar5) {
        lVar6 = 0;
        uVar7 = 0;
        do {
          uVar8 = (ulong)(uint)pVVar2[lVar9].pArray[lVar6];
          if (0xff < uVar8) {
            __assert_fail("i >= 0 && i < PLA_HASH_VALUE_NUM",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaHash.c"
                          ,0x42,"int Pla_HashValue(int)");
          }
          uVar7 = uVar7 + (s_PlaHashValues[uVar8] & 0x3ffffff);
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
      }
      Vec_IntPush(&p->vHashes,uVar7);
      pTVar3 = pTab->pBins;
      uVar7 = uVar7 & pTab->SizeMask;
      iVar1 = pTab->nBins;
      pTVar3[iVar1].Cube = (int)lVar9;
      *(uint *)&pTVar3[iVar1].field_0xc = *(uint *)&pTVar3[iVar1].field_0xc | 0xffff;
      pTVar3[iVar1].Next = pTVar3[(int)uVar7].Table;
      iVar1 = pTab->nBins;
      pTab->nBins = iVar1 + 1;
      pTVar3[(int)uVar7].Table = iVar1;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vCubeLits).nSize);
  }
  return;
}

Assistant:

void Pla_ManHashCubes( Pla_Man_t * p, Tab_Man_t * pTab )
{
    Vec_Int_t * vCube; int i, Value;
    Vec_IntClear( &p->vHashes );
    Vec_IntGrow( &p->vHashes, Pla_ManCubeNum(p) );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
    {
        Value = Pla_CubeHashValue(vCube);
        Vec_IntPush( &p->vHashes, Value );
        Tab_ManHashInsert( pTab, Value, i, PLA_LIT_UNUSED );
    }
}